

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_fasta.cpp
# Opt level: O2

bool __thiscall
BamTools::Fasta::FastaPrivate::GetNameFromHeader(FastaPrivate *this,string *header,string *name)

{
  ostream *poVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  string local_50 [32];
  string s;
  
  std::__cxx11::string::substr((ulong)&s,(ulong)header);
  uVar5 = 0;
  do {
    if ((0x20 < (ulong)(byte)s._M_dataplus._M_p[uVar5]) ||
       ((0x100002600U >> ((ulong)(byte)s._M_dataplus._M_p[uVar5] & 0x3f) & 1) == 0)) {
      if ((uint)uVar5 < (uint)s._M_string_length) {
        uVar4 = uVar5 & 0xffffffff;
        goto LAB_001a8658;
      }
      break;
    }
    uVar5 = uVar5 + 1;
  } while ((uint)s._M_string_length != (uint)uVar5);
  goto LAB_001a8621;
  while (uVar2 = (uint)uVar4 + 1, uVar4 = (ulong)uVar2, uVar3 = (uint)s._M_string_length,
        (uint)s._M_string_length != uVar2) {
LAB_001a8658:
    if (((ulong)(byte)s._M_dataplus._M_p[uVar4] < 0x21) &&
       (uVar3 = (uint)uVar4,
       (0x100002600U >> ((ulong)(byte)s._M_dataplus._M_p[uVar4] & 0x3f) & 1) != 0)) break;
  }
  if (uVar3 != (uint)uVar5) {
    std::__cxx11::string::substr((ulong)local_50,(ulong)&s);
    std::__cxx11::string::assign((char *)name);
    std::__cxx11::string::~string(local_50);
    bVar6 = true;
    goto LAB_001a863e;
  }
LAB_001a8621:
  poVar1 = std::operator<<((ostream *)&std::cerr,
                           "FASTA error : could not parse read name from FASTA header");
  std::endl<char,std::char_traits<char>>(poVar1);
  bVar6 = false;
LAB_001a863e:
  std::__cxx11::string::~string((string *)&s);
  return bVar6;
}

Assistant:

bool Fasta::FastaPrivate::GetNameFromHeader(const std::string& header, std::string& name)
{

    // get rid of the leading greater than sign
    std::string s = header.substr(1);

    // extract the first non-whitespace segment
    char* pName = (char*)s.data();
    unsigned int nameLen = (unsigned int)s.size();

    unsigned int start = 0;
    while ((pName[start] == 32) || (pName[start] == 9) || (pName[start] == 10) ||
           (pName[start] == 13)) {
        start++;
        if (start == nameLen) break;
    }

    unsigned int stop = start;
    if (stop < nameLen) {
        while ((pName[stop] != 32) && (pName[stop] != 9) && (pName[stop] != 10) &&
               (pName[stop] != 13)) {
            stop++;
            if (stop == nameLen) break;
        }
    }

    if (start == stop) {
        std::cerr << "FASTA error : could not parse read name from FASTA header" << std::endl;
        return false;
    }

    name = s.substr(start, stop - start).c_str();
    return true;
}